

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Variable * __thiscall
soul::PoolAllocator::
allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
          (PoolAllocator *this,CodeLocation *args,Type *args_1,Identifier *args_2,Role *args_3)

{
  PoolItem *pPVar1;
  CodeLocation local_58;
  Type local_48;
  
  pPVar1 = allocateSpaceForObject(this,0x88);
  local_58.sourceCode.object = (args->sourceCode).object;
  if (local_58.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_58.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_58.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_58.location.data = (args->location).data;
  local_48.category = args_1->category;
  local_48.arrayElementCategory = args_1->arrayElementCategory;
  local_48.isRef = args_1->isRef;
  local_48.isConstant = args_1->isConstant;
  local_48.primitiveType.type = (args_1->primitiveType).type;
  local_48.boundingSize = args_1->boundingSize;
  local_48.arrayElementBoundingSize = args_1->arrayElementBoundingSize;
  local_48.structure.object = (args_1->structure).object;
  (args_1->structure).object = (Structure *)0x0;
  heart::Variable::Variable
            ((Variable *)&pPVar1->item,&local_58,&local_48,(Identifier)args_2->name,*args_3);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_58.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::Variable,_soul::CodeLocation_&,_soul::Type,_soul::Identifier,_soul::heart::Variable::Role_&>
       ::anon_class_1_0_00000001::__invoke;
  return (Variable *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }